

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_array_walk(jx9_value *pArray,_func_int_jx9_value_ptr_jx9_value_ptr_void_ptr *xWalk,
                  void *pUserData)

{
  sxi32 sVar1;
  int iVar2;
  
  iVar2 = -0x18;
  if ((xWalk != (_func_int_jx9_value_ptr_jx9_value_ptr_void_ptr *)0x0) &&
     ((pArray->iFlags & 0x40) != 0)) {
    sVar1 = jx9HashmapWalk((jx9_hashmap *)(pArray->x).pOther,xWalk,pUserData);
    iVar2 = -10;
    if (sVar1 == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

JX9_PRIVATE int jx9_array_walk(jx9_value *pArray, int (*xWalk)(jx9_value *pValue, jx9_value *, void *), void *pUserData)
{
	int rc;
	if( xWalk == 0 ){
		return JX9_CORRUPT;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return JX9_CORRUPT;
	}
	/* Start the walk process */
	rc = jx9HashmapWalk((jx9_hashmap *)pArray->x.pOther, xWalk, pUserData);
	return rc != JX9_OK ? JX9_ABORT /* User callback request an operation abort*/ : JX9_OK;
}